

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binder.cpp
# Opt level: O2

void __thiscall duckdb::Binder::PushExpressionBinder(Binder *this,ExpressionBinder *binder)

{
  vector<std::reference_wrapper<duckdb::ExpressionBinder>,std::allocator<std::reference_wrapper<duckdb::ExpressionBinder>>>
  *this_00;
  reference_wrapper<duckdb::ExpressionBinder> local_10;
  
  this_00 = (vector<std::reference_wrapper<duckdb::ExpressionBinder>,std::allocator<std::reference_wrapper<duckdb::ExpressionBinder>>>
             *)GetActiveBinders(this);
  local_10._M_data = binder;
  ::std::
  vector<std::reference_wrapper<duckdb::ExpressionBinder>,std::allocator<std::reference_wrapper<duckdb::ExpressionBinder>>>
  ::emplace_back<std::reference_wrapper<duckdb::ExpressionBinder>>(this_00,&local_10);
  return;
}

Assistant:

void Binder::PushExpressionBinder(ExpressionBinder &binder) {
	GetActiveBinders().push_back(binder);
}